

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_tuple.h
# Opt level: O0

void __thiscall
absl::lts_20240722::container_internal::
CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
::~CompressedTuple(CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
                   *this)

{
  CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>
  *this_local;
  
  internal_compressed_tuple::
  CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  ::~CompressedTupleImpl
            (&this->
              super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
            );
  return;
}

Assistant:

class ABSL_INTERNAL_COMPRESSED_TUPLE_DECLSPEC CompressedTuple
    : private internal_compressed_tuple::CompressedTupleImpl<
          CompressedTuple<Ts...>, absl::index_sequence_for<Ts...>,
          internal_compressed_tuple::ShouldAnyUseBase<Ts...>()> {
 private:
  template <int I>
  using ElemT = internal_compressed_tuple::ElemT<CompressedTuple, I>;

  template <int I>
  using StorageT = internal_compressed_tuple::Storage<ElemT<I>, I>;

 public:
  // There seems to be a bug in MSVC dealing in which using '=default' here will
  // cause the compiler to ignore the body of other constructors. The work-
  // around is to explicitly implement the default constructor.
#if defined(_MSC_VER)
  constexpr CompressedTuple() : CompressedTuple::CompressedTupleImpl() {}
#else
  constexpr CompressedTuple() = default;
#endif
  explicit constexpr CompressedTuple(const Ts&... base)
      : CompressedTuple::CompressedTupleImpl(absl::in_place, base...) {}

  template <typename First, typename... Vs,
            absl::enable_if_t<
                absl::conjunction<
                    // Ensure we are not hiding default copy/move constructors.
                    absl::negation<std::is_same<void(CompressedTuple),
                                                void(absl::decay_t<First>)>>,
                    internal_compressed_tuple::TupleItemsMoveConstructible<
                        CompressedTuple<Ts...>, First, Vs...>>::value,
                bool> = true>
  explicit constexpr CompressedTuple(First&& first, Vs&&... base)
      : CompressedTuple::CompressedTupleImpl(absl::in_place,
                                             std::forward<First>(first),
                                             std::forward<Vs>(base)...) {}

  template <int I>
  constexpr ElemT<I>& get() & {
    return StorageT<I>::get();
  }

  template <int I>
  constexpr const ElemT<I>& get() const& {
    return StorageT<I>::get();
  }

  template <int I>
  constexpr ElemT<I>&& get() && {
    return std::move(*this).StorageT<I>::get();
  }

  template <int I>
  constexpr const ElemT<I>&& get() const&& {
    return std::move(*this).StorageT<I>::get();
  }
}